

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O3

bool __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::CheckBuffer
          (BlendMaskStateMachine *this,int idx)

{
  ostringstream *poVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  pointer pBVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  GLboolean ba [4];
  GLfloat fa [4];
  GLint ia [4];
  GLint64 lia [4];
  byte local_201;
  byte local_200;
  byte local_1ff;
  byte local_1fe;
  byte local_1fd;
  byte local_1fc;
  byte local_1fb;
  byte local_1fa;
  byte local_1f9;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  uint local_1e8;
  uint local_1e4;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8 [2];
  uint local_1d0;
  uint local_1c8;
  uint local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  bVar6 = (*this->gl->isEnabledi)(0xbe2,idx);
  pBVar5 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar5[idx].enable != (uint)bVar6) {
    local_1b0._0_8_ = this->testLog;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Blending for buffer #",0x15);
    std::ostream::operator<<(poVar1,idx);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," set to: ",9);
    std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," but should be ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"!",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_00d77361;
  }
  local_1f9 = CheckEnumForBuffer(this,idx,0x8009,pBVar5[idx].mode_rgb);
  local_1fa = CheckEnumForBuffer(this,idx,0x883d,
                                 (this->state).
                                 super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                 ._M_impl.super__Vector_impl_data._M_start[idx].mode_a);
  local_1fb = CheckEnumForBuffer(this,idx,0x80c9,
                                 (this->state).
                                 super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                 ._M_impl.super__Vector_impl_data._M_start[idx].func_src_rgb);
  bVar7 = CheckEnumForBuffer(this,idx,0x80cb,
                             (this->state).
                             super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                             ._M_impl.super__Vector_impl_data._M_start[idx].func_src_a);
  local_1fc = CheckEnumForBuffer(this,idx,0x80c8,
                                 (this->state).
                                 super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                 ._M_impl.super__Vector_impl_data._M_start[idx].func_dst_rgb);
  bVar8 = CheckEnumForBuffer(this,idx,0x80ca,
                             (this->state).
                             super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                             ._M_impl.super__Vector_impl_data._M_start[idx].func_dst_a);
  (*this->gl->getIntegeri_v)(0xc23,idx,(GLint *)&local_1e8);
  (*this->gl->getInteger64i_v)(0xc23,idx,(GLint64 *)local_1d8);
  (*this->gl->getBooleani_v)(0xc23,idx,&local_200);
  pBVar5 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar6 = pBVar5[idx].mask_r;
  if (((local_1e8 == bVar6) && (local_1d8[0] == bVar6)) && (local_200 == bVar6)) {
    bVar6 = pBVar5[idx].mask_g;
    if (((local_1e4 != bVar6) || (local_1d0 != bVar6)) || (local_1ff != bVar6)) goto LAB_00d76ac3;
    bVar6 = pBVar5[idx].mask_b;
    if (((local_1e0 != bVar6) || (local_1c8 != bVar6)) || (local_1fe != bVar6)) goto LAB_00d76ac3;
    bVar6 = pBVar5[idx].mask_a;
    if (((local_1dc != bVar6) || (local_1c0 != bVar6)) || (local_1fd != bVar6)) goto LAB_00d76ac3;
    bVar7 = (bool)(bVar7 & local_1fc & bVar8 & local_1f9 & local_1fa & local_1fb);
  }
  else {
LAB_00d76ac3:
    local_1b0._0_8_ = this->testLog;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GL_COLOR_WRITEMASK for buffer #",0x1f);
    std::ostream::operator<<(poVar1,idx);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," should be set to(",0x12);
    local_1f8._0_1_ =
         (this->state).
         super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
         ._M_impl.super__Vector_impl_data._M_start[idx].mask_r;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    local_1f8._0_1_ =
         (this->state).
         super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
         ._M_impl.super__Vector_impl_data._M_start[idx].mask_g;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    local_1f8._0_1_ =
         (this->state).
         super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
         ._M_impl.super__Vector_impl_data._M_start[idx].mask_b;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    local_1f8._0_1_ =
         (this->state).
         super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
         ._M_impl.super__Vector_impl_data._M_start[idx].mask_a;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"but the following values was set:\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"int: ",5);
    std::ostream::operator<<(poVar1,local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,local_1e4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,local_1dc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"int64: ",7);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"bool: ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    local_1f8 = (float)CONCAT31(local_1f8._1_3_,local_1fd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    bVar7 = false;
  }
  if (idx != 0) {
    return bVar7;
  }
  local_1f9 = CheckEnumGeneral(this,0x8009,
                               ((this->state).
                                super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                ._M_impl.super__Vector_impl_data._M_start)->mode_rgb);
  local_1fa = bVar7 != false;
  local_1fb = CheckEnumGeneral(this,0x883d,
                               (this->state).
                               super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                               ._M_impl.super__Vector_impl_data._M_start[idx].mode_a);
  local_1fc = CheckEnumGeneral(this,0x80c9,
                               (this->state).
                               super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                               ._M_impl.super__Vector_impl_data._M_start[idx].func_src_rgb);
  bVar7 = CheckEnumGeneral(this,0x80cb,
                           (this->state).
                           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                           ._M_impl.super__Vector_impl_data._M_start[idx].func_src_a);
  bVar8 = CheckEnumGeneral(this,0x80c8,
                           (this->state).
                           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                           ._M_impl.super__Vector_impl_data._M_start[idx].func_dst_rgb);
  bVar9 = CheckEnumGeneral(this,0x80ca,
                           (this->state).
                           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                           ._M_impl.super__Vector_impl_data._M_start[idx].func_dst_a);
  (*this->gl->getIntegerv)(0xc23,(GLint *)&local_1e8);
  (*this->gl->getInteger64v)(0xc23,(GLint64 *)local_1d8);
  (*this->gl->getBooleanv)(0xc23,&local_200);
  (*this->gl->getFloatv)(0xc23,&local_1f8);
  pBVar5 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar6 = pBVar5[idx].mask_r;
  if ((local_1e8 == bVar6) && (local_1d8[0] == bVar6)) {
    bVar2 = pBVar5[idx].mask_g;
    if ((local_1e4 == bVar2) && (local_1d0 == bVar2)) {
      bVar3 = pBVar5[idx].mask_b;
      if ((local_1e0 == bVar3) && (local_1c8 == bVar3)) {
        bVar4 = pBVar5[idx].mask_a;
        if ((local_1dc == bVar4) &&
           ((((((local_1c0 == bVar4 && (local_200 == bVar6)) && (local_1e8 == (int)local_1f8)) &&
              ((local_1ff == bVar2 && (local_1e4 == (int)local_1f4)))) &&
             ((local_1fe == bVar3 && ((local_1e0 == (int)local_1f0 && (local_1fd == bVar4)))))) &&
            (local_1dc == (int)local_1ec)))) {
          return (bool)(local_1f9 & local_1fb & local_1fc & bVar7 & bVar8 & bVar9 & local_1fa);
        }
      }
    }
  }
  local_1b0._0_8_ = this->testLog;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"GL_COLOR_WRITEMASK for buffer #",0x1f);
  std::ostream::operator<<(poVar1,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," should be set to(",0x12);
  local_201 = (this->state).
              super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ._M_impl.super__Vector_impl_data._M_start[idx].mask_r;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_201,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  local_201 = (this->state).
              super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ._M_impl.super__Vector_impl_data._M_start[idx].mask_g;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_201,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  local_201 = (this->state).
              super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ._M_impl.super__Vector_impl_data._M_start[idx].mask_b;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_201,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  local_201 = (this->state).
              super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
              ._M_impl.super__Vector_impl_data._M_start[idx].mask_a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_201,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"but the following values was set:\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"int: ",5);
  std::ostream::operator<<(poVar1,local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,local_1e4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,local_1dc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"int64: ",7);
  std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"bool: ",6);
  local_201 = local_200;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_201,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  local_201 = local_1ff;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_201,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  local_201 = local_1fe;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_201,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  local_201 = local_1fd;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_201,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"float: ",7);
  std::ostream::_M_insert<double>((double)local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_1f4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_1ec);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00d77361:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool DrawBuffersIndexedBase::BlendMaskStateMachine::CheckBuffer(int idx)
{
	if (gl.isEnabledi(GL_BLEND, idx) != state[idx].enable)
	{
		testLog << tcu::TestLog::Message << "Blending for buffer #" << idx << " set to: " << !state[idx].enable
				<< " but should be " << state[idx].enable << "!" << tcu::TestLog::EndMessage;
		return false;
	}

	bool result = true;

	result &= CheckEnumForBuffer(idx, GL_BLEND_EQUATION_RGB, state[idx].mode_rgb);
	result &= CheckEnumForBuffer(idx, GL_BLEND_EQUATION_ALPHA, state[idx].mode_a);
	result &= CheckEnumForBuffer(idx, GL_BLEND_SRC_RGB, state[idx].func_src_rgb);
	result &= CheckEnumForBuffer(idx, GL_BLEND_SRC_ALPHA, state[idx].func_src_a);
	result &= CheckEnumForBuffer(idx, GL_BLEND_DST_RGB, state[idx].func_dst_rgb);
	result &= CheckEnumForBuffer(idx, GL_BLEND_DST_ALPHA, state[idx].func_dst_a);

	glw::GLint	 ia[4];
	glw::GLint64   lia[4];
	glw::GLboolean ba[4];

	gl.getIntegeri_v(GL_COLOR_WRITEMASK, idx, ia);
	gl.getInteger64i_v(GL_COLOR_WRITEMASK, idx, lia);
	gl.getBooleani_v(GL_COLOR_WRITEMASK, idx, ba);
	if ((ia[0] != state[idx].mask_r) || (static_cast<int>(lia[0]) != state[idx].mask_r) ||
		(static_cast<int>(ba[0]) != state[idx].mask_r) || (ia[1] != state[idx].mask_g) ||
		(static_cast<int>(lia[1]) != state[idx].mask_g) || (static_cast<int>(ba[1]) != state[idx].mask_g) ||
		(ia[2] != state[idx].mask_b) || (static_cast<int>(lia[2]) != state[idx].mask_b) ||
		(static_cast<int>(ba[2]) != state[idx].mask_b) || (ia[3] != state[idx].mask_a) ||
		(static_cast<int>(lia[3]) != state[idx].mask_a) || (static_cast<int>(ba[3]) != state[idx].mask_a))
	{
		testLog << tcu::TestLog::Message << "GL_COLOR_WRITEMASK for buffer #" << idx << " should be set to("
				<< state[idx].mask_r << ", " << state[idx].mask_g << ", " << state[idx].mask_b << ", "
				<< state[idx].mask_a << ")\n"
				<< "but the following values was set:\n"
				<< "int: " << ia[0] << ", " << ia[1] << ", " << ia[2] << ", " << ia[3] << "\n"
				<< "int64: " << lia[0] << ", " << lia[1] << ", " << lia[2] << ", " << lia[3] << "\n"
				<< "bool: " << ba[0] << ", " << ba[1] << ", " << ba[2] << ", " << ba[3] << tcu::TestLog::EndMessage;
		result = false;
	}
	if (idx == 0)
	{
		result &= CheckEnumGeneral(GL_BLEND_EQUATION_RGB, state[idx].mode_rgb);
		result &= CheckEnumGeneral(GL_BLEND_EQUATION_ALPHA, state[idx].mode_a);
		result &= CheckEnumGeneral(GL_BLEND_SRC_RGB, state[idx].func_src_rgb);
		result &= CheckEnumGeneral(GL_BLEND_SRC_ALPHA, state[idx].func_src_a);
		result &= CheckEnumGeneral(GL_BLEND_DST_RGB, state[idx].func_dst_rgb);
		result &= CheckEnumGeneral(GL_BLEND_DST_ALPHA, state[idx].func_dst_a);

		glw::GLfloat fa[4];

		gl.getIntegerv(GL_COLOR_WRITEMASK, ia);
		gl.getInteger64v(GL_COLOR_WRITEMASK, lia);
		gl.getBooleanv(GL_COLOR_WRITEMASK, ba);
		gl.getFloatv(GL_COLOR_WRITEMASK, fa);
		if ((ia[0] != state[idx].mask_r) || (static_cast<int>(lia[0]) != state[idx].mask_r) ||
			(ia[1] != state[idx].mask_g) || (static_cast<int>(lia[1]) != state[idx].mask_g) ||
			(ia[2] != state[idx].mask_b) || (static_cast<int>(lia[2]) != state[idx].mask_b) ||
			(ia[3] != state[idx].mask_a) || (static_cast<int>(lia[3]) != state[idx].mask_a) ||
			(static_cast<int>(ba[0]) != state[idx].mask_r) || (static_cast<int>(fa[0]) != state[idx].mask_r) ||
			(static_cast<int>(ba[1]) != state[idx].mask_g) || (static_cast<int>(fa[1]) != state[idx].mask_g) ||
			(static_cast<int>(ba[2]) != state[idx].mask_b) || (static_cast<int>(fa[2]) != state[idx].mask_b) ||
			(static_cast<int>(ba[3]) != state[idx].mask_a) || (static_cast<int>(fa[3]) != state[idx].mask_a))
		{
			testLog << tcu::TestLog::Message << "GL_COLOR_WRITEMASK for buffer #" << idx << " should be set to("
					<< state[idx].mask_r << ", " << state[idx].mask_g << ", " << state[idx].mask_b << ", "
					<< state[idx].mask_a << ")\n"
					<< "but the following values was set:\n"
					<< "int: " << ia[0] << ", " << ia[1] << ", " << ia[2] << ", " << ia[3] << "\n"
					<< "int64: " << lia[0] << ", " << lia[1] << ", " << lia[2] << ", " << lia[3] << "\n"
					<< "bool: " << ba[0] << ", " << ba[1] << ", " << ba[2] << ", " << ba[3] << "\n"
					<< "float: " << fa[0] << ", " << fa[1] << ", " << fa[2] << ", " << fa[3]
					<< tcu::TestLog::EndMessage;
			result = false;
		}
	}
	return result;
}